

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int wally_base64_get_maximum_length(char *str_in,uint32_t flags,size_t *written)

{
  size_t srclen;
  size_t sVar1;
  size_t *written_local;
  uint32_t flags_local;
  char *str_in_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((str_in == (char *)0x0) || (*str_in == '\0')) || (flags != 0)) || (written == (size_t *)0x0)
     ) {
    str_in_local._4_4_ = -2;
  }
  else {
    srclen = strlen(str_in);
    sVar1 = base64_decoded_length(srclen);
    *written = sVar1;
    str_in_local._4_4_ = 0;
  }
  return str_in_local._4_4_;
}

Assistant:

int wally_base64_get_maximum_length(const char *str_in, uint32_t flags, size_t *written)
{
    if (written)
        *written = 0;

    if (!str_in || !*str_in || flags || !written)
        return WALLY_EINVAL;

    *written = base64_decoded_length(strlen(str_in));
    return WALLY_OK;
}